

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::logVertexArrayState
          (MultiVertexArrayObjectTest *this,TestLog *log,VertexArrayState *state,string *msg)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  MessageBuilder *this_00;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  MessageBuilder local_340;
  int local_1c0;
  int attribNdx;
  stringstream local_1b0 [8];
  stringstream message;
  ostream local_1a0 [376];
  string *local_28;
  string *msg_local;
  VertexArrayState *state_local;
  TestLog *log_local;
  MultiVertexArrayObjectTest *this_local;
  
  local_28 = msg;
  msg_local = (string *)state;
  state_local = (VertexArrayState *)log;
  log_local = (TestLog *)this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::operator<<(local_1a0,(string *)local_28);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(local_1a0,"GL_ELEMENT_ARRAY_BUFFER : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)&msg_local->field_2 + 8));
  std::operator<<(poVar2,"\n");
  local_1c0 = 0;
  while( true ) {
    iVar1 = local_1c0;
    sVar3 = std::
            vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
            ::size((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                    *)msg_local);
    if ((int)sVar3 <= iVar1) break;
    poVar2 = std::operator<<(local_1a0,"attribute : ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c0);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_ENABLED : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    pcVar6 = "GL_FALSE";
    if (pvVar4->enabled != '\0') {
      pcVar6 = "GL_TRUE";
    }
    poVar2 = std::operator<<(poVar2,pcVar6);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_SIZE : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar4->size);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_STRIDE : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar4->stride);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_TYPE : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar4->type);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_NORMALIZED : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    pcVar6 = "GL_FALSE";
    if (pvVar4->normalized != '\0') {
      pcVar6 = "GL_TRUE";
    }
    poVar2 = std::operator<<(poVar2,pcVar6);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_INTEGER : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    pcVar6 = "GL_FALSE";
    if (pvVar4->integer != '\0') {
      pcVar6 = "GL_TRUE";
    }
    poVar2 = std::operator<<(poVar2,pcVar6);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_DIVISOR : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar4->divisor);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_POINTER : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar4->offset);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\t GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING : ");
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           *)msg_local,(long)local_1c0);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_buffers,(long)pvVar4->bufferNdx);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar5);
    std::operator<<(poVar2,"\n");
    local_1c0 = local_1c0 + 1;
  }
  tcu::TestLog::operator<<
            (&local_340,(TestLog *)state_local,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::stringstream::str();
  this_00 = tcu::MessageBuilder::operator<<(&local_340,&local_360);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_360);
  tcu::MessageBuilder::~MessageBuilder(&local_340);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void MultiVertexArrayObjectTest::logVertexArrayState (tcu::TestLog& log, const VertexArrayState& state, const std::string& msg)
{
	std::stringstream message;

	message << msg << "\n";
	message << "GL_ELEMENT_ARRAY_BUFFER : " << state.elementArrayBuffer << "\n";

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		message
		<< "attribute : " << attribNdx << "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_ENABLED : " << (state.attributes[attribNdx].enabled ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_SIZE : " << state.attributes[attribNdx].size <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_STRIDE : " << state.attributes[attribNdx].stride <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_TYPE : " << state.attributes[attribNdx].type <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_NORMALIZED : " << (state.attributes[attribNdx].normalized ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_INTEGER : " << (state.attributes[attribNdx].integer ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_DIVISOR : " << state.attributes[attribNdx].divisor <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_POINTER : " << state.attributes[attribNdx].offset <<  "\n"
		<< "\t GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING : " << m_buffers[state.attributes[attribNdx].bufferNdx] <<  "\n";
	}
	log << tcu::TestLog::Message << message.str() << tcu::TestLog::EndMessage;
}